

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initsout.c
# Opt level: O2

void init_for_bltchar(void)

{
  if (for_makeinit == 0) {
    BLTCHAR_index = get_package_atom("\\MAIKO.PUNTBLTCHAR",0x12,"INTERLISP",9,0);
    TEDIT_BLTCHAR_index = get_package_atom("\\TEDIT.BLTCHAR",0xe,"INTERLISP",9,0);
  }
  TOPWDS68k = MakeAtom68k("\\TOPWDS");
  return;
}

Assistant:

void init_for_bltchar(void) {
#ifdef COLOR
  LispPTR index;
#endif
  char *IL;

  extern LispPTR *TOPWDS68k;
#ifdef COLOR
  extern LispPTR *SCREENBITMAPS68k;
  extern LispPTR *COLORSCREEN68k; /*  \\COLORSCREEN */
#endif
  IL = "INTERLISP";

  if (!for_makeinit) {
    BLTCHAR_index = get_package_atom("\\MAIKO.PUNTBLTCHAR", 18, IL, 9, NIL);
    TEDIT_BLTCHAR_index = get_package_atom("\\TEDIT.BLTCHAR", 14, IL, 9, NIL);
  }
  TOPWDS68k = MakeAtom68k("\\TOPWDS");

#ifdef COLOR
  if (!for_makeinit) {
    SLOWBLTCHAR_index = get_package_atom("\\PUNT.SLOWBLTCHAR", 17, "INTERLISP", 9, NIL);

    index = MAKEATOM("\\SCREENBITMAPS");
    SCREENBITMAPS68k = GetVALCELL68k(index);
    COLORSCREEN_index = MAKEATOM("\\COLORSCREEN");
    COLORSCREEN68k = GetVALCELL68k(COLORSCREEN_index);
  }

#endif /* COLOR */
}